

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool param_3)

{
  uint uVar1;
  long *plVar2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *w;
  pointer pnVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  type_conflict5 tVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  double *pdVar8;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined8 uVar9;
  long lVar12;
  long lVar13;
  long lVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  cpp_dec_float<200U,_int,_void> *pcVar18;
  uint *puVar19;
  pointer pnVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  uint *puVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  byte bVar27;
  ulong uVar28;
  uint local_f5c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  SPxId enterId;
  double local_e88;
  cpp_dec_float<200U,_int,_void> *local_e80;
  long *local_e78;
  long *local_e70;
  long local_e68;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_e60;
  cpp_dec_float<200U,_int,_void> local_e58;
  long *local_dd8;
  long *local_dd0;
  cpp_dec_float<200U,_int,_void> local_dc8;
  cpp_dec_float<200U,_int,_void> local_d48;
  cpp_dec_float<200U,_int,_void> local_cc8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bb8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  degeneps;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a38;
  cpp_dec_float<200U,_int,_void> local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rmaxabs;
  cpp_dec_float<200U,_int,_void> local_838;
  cpp_dec_float<200U,_int,_void> local_7b8;
  cpp_dec_float<200U,_int,_void> local_738;
  cpp_dec_float<200U,_int,_void> local_6b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minStability;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cmaxabs;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  undefined8 uVar10;
  undefined8 uVar11;
  
  bVar27 = 0;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_cc8.fpclass = cpp_dec_float_finite;
  local_cc8.prec_elem = 0x1c;
  local_cc8.data._M_elems[0] = 0;
  local_cc8.data._M_elems[1] = 0;
  local_cc8.data._M_elems[2] = 0;
  local_cc8.data._M_elems[3] = 0;
  local_cc8.data._M_elems[4] = 0;
  local_cc8.data._M_elems[5] = 0;
  local_cc8.data._M_elems[6] = 0;
  local_cc8.data._M_elems[7] = 0;
  local_cc8.data._M_elems[8] = 0;
  local_cc8.data._M_elems[9] = 0;
  local_cc8.data._M_elems[10] = 0;
  local_cc8.data._M_elems[0xb] = 0;
  local_cc8.data._M_elems[0xc] = 0;
  local_cc8.data._M_elems[0xd] = 0;
  local_cc8.data._M_elems[0xe] = 0;
  local_cc8.data._M_elems[0xf] = 0;
  local_cc8.data._M_elems[0x18] = 0;
  local_cc8.data._M_elems[0x19] = 0;
  local_cc8.data._M_elems._104_5_ = 0;
  local_cc8.data._M_elems[0x1b]._1_3_ = 0;
  local_cc8.exp = 0;
  local_cc8.neg = false;
  local_cc8.data._M_elems[0x10] = 0;
  local_cc8.data._M_elems[0x11] = 0;
  local_cc8.data._M_elems[0x12] = 0;
  local_cc8.data._M_elems[0x13] = 0;
  local_cc8.data._M_elems[0x14] = 0;
  local_cc8.data._M_elems[0x15] = 0;
  local_cc8.data._M_elems[0x16] = 0;
  local_cc8.data._M_elems[0x17] = 0;
  local_e58.fpclass = cpp_dec_float_finite;
  local_e58.prec_elem = 0x1c;
  local_e58.data._M_elems[0] = 0;
  local_e58.data._M_elems[1] = 0;
  local_e58.data._M_elems[2] = 0;
  local_e58.data._M_elems[3] = 0;
  local_e58.data._M_elems[4] = 0;
  local_e58.data._M_elems[5] = 0;
  local_e58.data._M_elems[6] = 0;
  local_e58.data._M_elems[7] = 0;
  local_e58.data._M_elems[8] = 0;
  local_e58.data._M_elems[9] = 0;
  local_e58.data._M_elems[10] = 0;
  local_e58.data._M_elems[0xb] = 0;
  local_e58.data._M_elems[0xc] = 0;
  local_e58.data._M_elems[0xd] = 0;
  local_e58.data._M_elems[0xe] = 0;
  local_e58.data._M_elems[0xf] = 0;
  local_e58.data._M_elems[0x10] = 0;
  local_e58.data._M_elems[0x11] = 0;
  local_e58.data._M_elems[0x12] = 0;
  local_e58.data._M_elems[0x13] = 0;
  local_e58.data._M_elems[0x18] = 0;
  local_e58.data._M_elems[0x19] = 0;
  local_e58.data._M_elems._104_5_ = 0;
  local_e58.data._M_elems[0x1b]._1_3_ = 0;
  local_e58.exp = 0;
  local_e58.neg = false;
  local_e58.data._M_elems[0x14] = 0;
  local_e58.data._M_elems[0x15] = 0;
  local_e58.data._M_elems[0x16] = 0;
  local_e58.data._M_elems[0x17] = 0;
  local_dc8.fpclass = cpp_dec_float_finite;
  local_dc8.prec_elem = 0x1c;
  local_dc8.data._M_elems[0] = 0;
  local_dc8.data._M_elems[1] = 0;
  local_dc8.data._M_elems[2] = 0;
  local_dc8.data._M_elems[3] = 0;
  local_dc8.data._M_elems[4] = 0;
  local_dc8.data._M_elems[5] = 0;
  local_dc8.data._M_elems[6] = 0;
  local_dc8.data._M_elems[7] = 0;
  local_dc8.data._M_elems[8] = 0;
  local_dc8.data._M_elems[9] = 0;
  local_dc8.data._M_elems[10] = 0;
  local_dc8.data._M_elems[0xb] = 0;
  local_dc8.data._M_elems[0xc] = 0;
  local_dc8.data._M_elems[0xd] = 0;
  local_dc8.data._M_elems[0xe] = 0;
  local_dc8.data._M_elems[0xf] = 0;
  local_dc8.data._M_elems[0x10] = 0;
  local_dc8.data._M_elems[0x11] = 0;
  local_dc8.data._M_elems[0x12] = 0;
  local_dc8.data._M_elems[0x13] = 0;
  local_dc8.data._M_elems[0x14] = 0;
  local_dc8.data._M_elems[0x15] = 0;
  local_dc8.data._M_elems[0x16] = 0;
  local_dc8.data._M_elems[0x17] = 0;
  local_dc8.data._M_elems[0x18] = 0;
  local_dc8.data._M_elems[0x19] = 0;
  local_dc8.data._M_elems._104_5_ = 0;
  local_dc8.data._M_elems[0x1b]._1_3_ = 0;
  local_dc8.exp = 0;
  local_dc8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_9b8,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_d48,0.0,(type *)0x0);
  local_a38.m_backend.fpclass = cpp_dec_float_finite;
  local_a38.m_backend.prec_elem = 0x1c;
  local_a38.m_backend.data._M_elems[0] = 0;
  local_a38.m_backend.data._M_elems[1] = 0;
  local_a38.m_backend.data._M_elems[2] = 0;
  local_a38.m_backend.data._M_elems[3] = 0;
  local_a38.m_backend.data._M_elems[4] = 0;
  local_a38.m_backend.data._M_elems[5] = 0;
  local_a38.m_backend.data._M_elems[6] = 0;
  local_a38.m_backend.data._M_elems[7] = 0;
  local_a38.m_backend.data._M_elems[8] = 0;
  local_a38.m_backend.data._M_elems[9] = 0;
  local_a38.m_backend.data._M_elems[10] = 0;
  local_a38.m_backend.data._M_elems[0xb] = 0;
  local_a38.m_backend.data._M_elems[0xc] = 0;
  local_a38.m_backend.data._M_elems[0xd] = 0;
  local_a38.m_backend.data._M_elems[0xe] = 0;
  local_a38.m_backend.data._M_elems[0xf] = 0;
  local_a38.m_backend.data._M_elems[0x18] = 0;
  local_a38.m_backend.data._M_elems[0x19] = 0;
  local_a38.m_backend.data._M_elems._104_5_ = 0;
  local_a38.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_a38.m_backend.exp = 0;
  local_a38.m_backend.neg = false;
  local_a38.m_backend.data._M_elems[0x10] = 0;
  local_a38.m_backend.data._M_elems[0x11] = 0;
  local_a38.m_backend.data._M_elems[0x12] = 0;
  local_a38.m_backend.data._M_elems[0x13] = 0;
  local_a38.m_backend.data._M_elems[0x14] = 0;
  local_a38.m_backend.data._M_elems[0x15] = 0;
  local_a38.m_backend.data._M_elems[0x16] = 0;
  local_a38.m_backend.data._M_elems[0x17] = 0;
  local_b38.m_backend.fpclass = cpp_dec_float_finite;
  local_b38.m_backend.prec_elem = 0x1c;
  local_b38.m_backend.data._M_elems[0] = 0;
  local_b38.m_backend.data._M_elems[1] = 0;
  local_b38.m_backend.data._M_elems[2] = 0;
  local_b38.m_backend.data._M_elems[3] = 0;
  local_b38.m_backend.data._M_elems[4] = 0;
  local_b38.m_backend.data._M_elems[5] = 0;
  local_b38.m_backend.data._M_elems[6] = 0;
  local_b38.m_backend.data._M_elems[7] = 0;
  local_b38.m_backend.data._M_elems[8] = 0;
  local_b38.m_backend.data._M_elems[9] = 0;
  local_b38.m_backend.data._M_elems[10] = 0;
  local_b38.m_backend.data._M_elems[0xb] = 0;
  local_b38.m_backend.data._M_elems[0xc] = 0;
  local_b38.m_backend.data._M_elems[0xd] = 0;
  local_b38.m_backend.data._M_elems[0xe] = 0;
  local_b38.m_backend.data._M_elems[0xf] = 0;
  local_b38.m_backend.data._M_elems[0x10] = 0;
  local_b38.m_backend.data._M_elems[0x11] = 0;
  local_b38.m_backend.data._M_elems[0x12] = 0;
  local_b38.m_backend.data._M_elems[0x13] = 0;
  local_b38.m_backend.data._M_elems[0x18] = 0;
  local_b38.m_backend.data._M_elems[0x19] = 0;
  local_b38.m_backend.data._M_elems._104_5_ = 0;
  local_b38.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_b38.m_backend.exp = 0;
  local_b38.m_backend.neg = false;
  local_b38.m_backend.data._M_elems[0x14] = 0;
  local_b38.m_backend.data._M_elems[0x15] = 0;
  local_b38.m_backend.data._M_elems[0x16] = 0;
  local_b38.m_backend.data._M_elems[0x17] = 0;
  local_bb8.m_backend.fpclass = cpp_dec_float_finite;
  local_bb8.m_backend.prec_elem = 0x1c;
  local_bb8.m_backend.data._M_elems[0] = 0;
  local_bb8.m_backend.data._M_elems[1] = 0;
  local_bb8.m_backend.data._M_elems[2] = 0;
  local_bb8.m_backend.data._M_elems[3] = 0;
  local_bb8.m_backend.data._M_elems[4] = 0;
  local_bb8.m_backend.data._M_elems[5] = 0;
  local_bb8.m_backend.data._M_elems[6] = 0;
  local_bb8.m_backend.data._M_elems[7] = 0;
  local_bb8.m_backend.data._M_elems[8] = 0;
  local_bb8.m_backend.data._M_elems[9] = 0;
  local_bb8.m_backend.data._M_elems[10] = 0;
  local_bb8.m_backend.data._M_elems[0xb] = 0;
  local_bb8.m_backend.data._M_elems[0xc] = 0;
  local_bb8.m_backend.data._M_elems[0xd] = 0;
  local_bb8.m_backend.data._M_elems[0xe] = 0;
  local_bb8.m_backend.data._M_elems[0xf] = 0;
  local_bb8.m_backend.data._M_elems[0x10] = 0;
  local_bb8.m_backend.data._M_elems[0x11] = 0;
  local_bb8.m_backend.data._M_elems[0x12] = 0;
  local_bb8.m_backend.data._M_elems[0x13] = 0;
  local_bb8.m_backend.data._M_elems[0x14] = 0;
  local_bb8.m_backend.data._M_elems[0x15] = 0;
  local_bb8.m_backend.data._M_elems[0x16] = 0;
  local_bb8.m_backend.data._M_elems[0x17] = 0;
  local_bb8.m_backend.data._M_elems[0x18] = 0;
  local_bb8.m_backend.data._M_elems[0x19] = 0;
  local_bb8.m_backend.data._M_elems._104_5_ = 0;
  local_bb8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_bb8.m_backend.exp = 0;
  local_bb8.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&cmaxabs.m_backend,1,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&rmaxabs.m_backend,1,(type *)0x0);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&epsilon,
             &(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar28 = -(ulong)(*(double *)(epsilon.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&minStability.m_backend,
             (double)(~uVar28 & (ulong)(*(double *)(epsilon.m_backend.data._M_elems._0_8_ + 0x40) *
                                       0.0001) | uVar28 & 0x3f1a36e2eb1c432d),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(epsilon.m_backend.data._M_elems + 2));
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(&epsilon,(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(extraout_var,iVar6));
  degenerateEps(&degeneps,this);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  plVar2 = *(long **)(CONCAT44(extraout_var_00,iVar6) + 0x1000);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar14 = *(long *)(CONCAT44(extraout_var_01,iVar6) + 0x1000);
  this_01 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(lVar14 + 0x98);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  w = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)(CONCAT44(extraout_var_02,iVar6) + 0xff8);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_e68 = *(long *)(CONCAT44(extraout_var_03,iVar6) + 0xff8);
  local_e60 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)(local_e68 + 0x98);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_e70 = *(long **)(CONCAT44(extraout_var_04,iVar6) + 0x1018);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_e78 = *(long **)(CONCAT44(extraout_var_05,iVar6) + 0x1020);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_dd0 = *(long **)(CONCAT44(extraout_var_06,iVar6) + 0x1028);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_dd8 = *(long **)(CONCAT44(extraout_var_07,iVar6) + 0x1030);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_08,iVar6) + 0xff8) + 0x98));
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_09,iVar6) + 0x1000) + 0x98));
  tVar4 = boost::multiprecision::operator>(val,&epsilon);
  local_e80 = &val->m_backend;
  if (tVar4) {
    local_c40 = &(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta;
LAB_00448f18:
    do {
      while( true ) {
        while( true ) {
          do {
            lVar13 = 0x1c;
            lVar12 = lVar13;
            pcVar18 = &val->m_backend;
            pcVar15 = &local_9b8;
            for (; lVar12 != 0; lVar12 = lVar12 + -1) {
              (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar18->data)->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_9b8.exp = (val->m_backend).exp;
            local_9b8.neg = (val->m_backend).neg;
            local_9b8.fpclass = (val->m_backend).fpclass;
            local_9b8.prec_elem = (val->m_backend).prec_elem;
            iVar6 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])(this);
            (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar6) + 0x368))
                      (&result_1.m_backend,(long *)CONCAT44(extraout_var_10,iVar6));
            pcVar18 = &result_1.m_backend;
            pnVar16 = &local_a38;
            for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar16->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
            }
            local_a38.m_backend.exp = result_1.m_backend.exp;
            local_a38.m_backend.neg = result_1.m_backend.neg;
            local_a38.m_backend.fpclass = result_1.m_backend.fpclass;
            local_a38.m_backend.prec_elem = result_1.m_backend.prec_elem;
            maxDelta(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&rmaxabs.m_backend,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_9b8,*(int *)(lVar14 + 0xa0),*(int **)(lVar14 + 0xa8),
                     *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       **)(lVar14 + 0xb8),
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*plVar2,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*local_e78,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*local_e70);
            maxDelta(this,&cmaxabs,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_9b8,*(int *)(local_e68 + 0xa0),*(int **)(local_e68 + 0xa8),
                     *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       **)(local_e68 + 0xb8),
                     (w->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*local_dd8,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*local_dd0);
            bVar5 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_9b8,val);
            if (bVar5) {
              uVar11._0_4_ = enterId.super_DataKey.info;
              uVar11._4_4_ = enterId.super_DataKey.idx;
              return (SPxId)uVar11;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_cc8,0)
            ;
            pdVar8 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result_1.m_backend,-*pdVar8,(type *)0x0);
            pcVar18 = &result_1.m_backend;
            pcVar15 = &local_d48;
            for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_d48.exp = result_1.m_backend.exp;
            local_d48.neg = result_1.m_backend.neg;
            local_d48.fpclass = result_1.m_backend.fpclass;
            local_d48.prec_elem = result_1.m_backend.prec_elem;
            local_e88 = 0.001;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                      (&result.m_backend,&rmaxabs.m_backend,&local_e88);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,&result.m_backend,&epsilon.m_backend);
            pnVar16 = &local_bb8;
            pcVar18 = &result_1.m_backend;
            pnVar17 = pnVar16;
            for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_bb8.m_backend.exp = result_1.m_backend.exp;
            local_bb8.m_backend.neg = result_1.m_backend.neg;
            local_bb8.m_backend.fpclass = result_1.m_backend.fpclass;
            local_bb8.m_backend.prec_elem = result_1.m_backend.prec_elem;
            tVar4 = boost::multiprecision::operator<
                              (pnVar16,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&epsilon.m_backend);
            lVar12 = lVar13;
            pcVar18 = &epsilon.m_backend;
            if (tVar4) {
              for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar16->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4)
                ;
                pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
              }
              local_bb8.m_backend.exp = epsilon.m_backend.exp;
              local_bb8.m_backend.neg = epsilon.m_backend.neg;
              local_bb8.m_backend.fpclass = epsilon.m_backend.fpclass;
              local_bb8.m_backend.prec_elem = epsilon.m_backend.prec_elem;
            }
            local_e88 = 0.001;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                      (&result.m_backend,&cmaxabs.m_backend,&local_e88);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,&result.m_backend,&epsilon.m_backend);
            pcVar18 = &result_1.m_backend;
            pnVar16 = &local_b38;
            for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar16->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_b38.m_backend.exp = result_1.m_backend.exp;
            local_b38.m_backend.neg = result_1.m_backend.neg;
            local_b38.m_backend.fpclass = result_1.m_backend.fpclass;
            local_b38.m_backend.prec_elem = result_1.m_backend.prec_elem;
            tVar4 = boost::multiprecision::operator<
                              (&local_b38,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&epsilon.m_backend);
            if (tVar4) {
              pnVar16 = &epsilon;
              pnVar17 = &local_b38;
              for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pnVar17->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
                pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
                pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
              }
              local_b38.m_backend.exp = epsilon.m_backend.exp;
              local_b38.m_backend.neg = epsilon.m_backend.neg;
              local_b38.m_backend.fpclass = epsilon.m_backend.fpclass;
              local_b38.m_backend.prec_elem = epsilon.m_backend.prec_elem;
            }
            uVar26 = *(uint *)(lVar14 + 0xa0);
            uVar25 = 0xffffffff;
            while( true ) {
              lVar12 = 0x1c;
              if ((int)uVar26 < 1) break;
              uVar26 = uVar26 - 1;
              uVar1 = *(uint *)(*(long *)(lVar14 + 0xa8) + (ulong)uVar26 * 4);
              pcVar18 = &result_1.m_backend;
              SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar18,this_01,uVar1);
              pcVar15 = pcVar18;
              pcVar21 = &local_e58;
              for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar21->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar27 * -8 + 4)
                ;
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar21 + ((ulong)bVar27 * -2 + 1) * 4);
              }
              local_e58.exp = result_1.m_backend.exp;
              local_e58.neg = result_1.m_backend.neg;
              local_e58.fpclass = result_1.m_backend.fpclass;
              local_e58.prec_elem = result_1.m_backend.prec_elem;
              pnVar16 = &local_bb8;
              tVar4 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_e58,pnVar16);
              lVar13 = lVar12;
              if (tVar4) {
                lVar23 = (long)(int)uVar1 * 0x80;
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (pcVar18,(cpp_dec_float<200U,_int,_void> *)(*local_e70 + lVar23),
                           (cpp_dec_float<200U,_int,_void> *)(*plVar2 + lVar23));
                pcVar15 = pcVar18;
                pcVar21 = &local_dc8;
                for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar21->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                  pcVar21 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar21 + (ulong)bVar27 * -8 + 4);
                }
                local_dc8.exp = result_1.m_backend.exp;
                local_dc8.neg = result_1.m_backend.neg;
                local_dc8.fpclass = result_1.m_backend.fpclass;
                local_dc8.prec_elem = result_1.m_backend.prec_elem;
                pnVar16 = &degeneps;
                for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar18->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
                  pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                }
                result_1.m_backend.exp = degeneps.m_backend.exp;
                result_1.m_backend.neg = degeneps.m_backend.neg;
                result_1.m_backend.fpclass = degeneps.m_backend.fpclass;
                result_1.m_backend.prec_elem = degeneps.m_backend.prec_elem;
                if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
                    result_1.m_backend.data._M_elems[0] != 0) {
                  result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                }
                tVar4 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_dc8,&result_1);
                if (tVar4) {
                  iVar6 = (*(this->
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._vptr_SPxRatioTester[3])(this);
                  local_6b8.fpclass = cpp_dec_float_finite;
                  local_6b8.prec_elem = 0x1c;
                  local_6b8.data._M_elems[0x18] = 0;
                  local_6b8.data._M_elems[0x19] = 0;
                  local_6b8.data._M_elems._104_5_ = 0;
                  local_6b8.data._M_elems[0x14] = 0;
                  local_6b8.data._M_elems[0x15] = 0;
                  local_6b8.data._M_elems[0x16] = 0;
                  local_6b8.data._M_elems[0x17] = 0;
                  local_6b8.data._M_elems[0x10] = 0;
                  local_6b8.data._M_elems[0x11] = 0;
                  local_6b8.data._M_elems[0x12] = 0;
                  local_6b8.data._M_elems[0x13] = 0;
                  local_6b8.data._M_elems[0xc] = 0;
                  local_6b8.data._M_elems[0xd] = 0;
                  local_6b8.data._M_elems[0xe] = 0;
                  local_6b8.data._M_elems[0xf] = 0;
                  local_6b8.data._M_elems[8] = 0;
                  local_6b8.data._M_elems[9] = 0;
                  local_6b8.data._M_elems[10] = 0;
                  local_6b8.data._M_elems[0xb] = 0;
                  local_6b8.data._M_elems[4] = 0;
                  local_6b8.data._M_elems[5] = 0;
                  local_6b8.data._M_elems[6] = 0;
                  local_6b8.data._M_elems[7] = 0;
                  local_6b8.data._M_elems[0] = 0;
                  local_6b8.data._M_elems[1] = 0;
                  local_6b8.data._M_elems[2] = 0;
                  local_6b8.data._M_elems[3] = 0;
                  local_6b8.data._M_elems[0x1b]._1_3_ = 0;
                  local_6b8.exp = 0;
                  local_6b8.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&local_6b8,(cpp_dec_float<200U,_int,_void> *)(lVar23 + *plVar2),
                             &degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_11,iVar6),uVar1,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_6b8);
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                            (&local_dc8,&local_e58);
                  tVar4 = boost::multiprecision::operator<=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_dc8,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_9b8);
                  if ((tVar4) &&
                     (tVar4 = boost::multiprecision::operator>=
                                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_e58,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_cc8), tVar4)) {
                    iVar6 = (*(this->
                              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._vptr_SPxRatioTester[3])(this);
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_13,iVar6),uVar1);
                    pcVar18 = &local_dc8;
                    pcVar15 = &local_d48;
                    for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                      (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                      pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                      pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
                    }
                    local_d48.exp = local_dc8.exp;
                    local_d48.neg = local_dc8.neg;
                    local_d48.fpclass = local_dc8.fpclass;
                    local_d48.prec_elem = local_dc8.prec_elem;
                    pcVar18 = &local_e58;
                    pcVar15 = &local_cc8;
                    for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                      (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                      pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                      pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                    }
                    local_cc8.exp = local_e58.exp;
                    local_cc8.neg = local_e58.neg;
                    local_cc8.fpclass = local_e58.fpclass;
                    local_cc8.prec_elem = local_e58.prec_elem;
                    uVar25 = uVar1;
                  }
                }
              }
              else {
                for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar18->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
                  pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                }
                result_1.m_backend.exp = local_bb8.m_backend.exp;
                result_1.m_backend.neg = local_bb8.m_backend.neg;
                result_1.m_backend.fpclass = local_bb8.m_backend.fpclass;
                result_1.m_backend.prec_elem = local_bb8.m_backend.prec_elem;
                if (local_bb8.m_backend.fpclass != cpp_dec_float_finite ||
                    result_1.m_backend.data._M_elems[0] != 0) {
                  result_1.m_backend.neg = (bool)(local_bb8.m_backend.neg ^ 1);
                }
                tVar4 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_e58,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&result_1.m_backend);
                if (tVar4) {
                  lVar13 = (long)(int)uVar1 * 0x80;
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 0x1c;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems[8] = 0;
                  result_1.m_backend.data._M_elems[9] = 0;
                  result_1.m_backend.data._M_elems[10] = 0;
                  result_1.m_backend.data._M_elems[0xb] = 0;
                  result_1.m_backend.data._M_elems[0xc] = 0;
                  result_1.m_backend.data._M_elems[0xd] = 0;
                  result_1.m_backend.data._M_elems[0xe] = 0;
                  result_1.m_backend.data._M_elems[0xf] = 0;
                  result_1.m_backend.data._M_elems[0x10] = 0;
                  result_1.m_backend.data._M_elems[0x11] = 0;
                  result_1.m_backend.data._M_elems[0x12] = 0;
                  result_1.m_backend.data._M_elems[0x13] = 0;
                  result_1.m_backend.data._M_elems[0x14] = 0;
                  result_1.m_backend.data._M_elems[0x15] = 0;
                  result_1.m_backend.data._M_elems[0x16] = 0;
                  result_1.m_backend.data._M_elems[0x17] = 0;
                  result_1.m_backend.data._M_elems[0x18] = 0;
                  result_1.m_backend.data._M_elems[0x19] = 0;
                  result_1.m_backend.data._M_elems._104_5_ = 0;
                  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&result_1.m_backend,
                             (cpp_dec_float<200U,_int,_void> *)(*local_e78 + lVar13),
                             (cpp_dec_float<200U,_int,_void> *)(*plVar2 + lVar13));
                  pcVar18 = &result_1.m_backend;
                  pcVar15 = &local_dc8;
                  for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                    pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                  }
                  local_dc8.exp = result_1.m_backend.exp;
                  local_dc8.neg = result_1.m_backend.neg;
                  local_dc8.fpclass = result_1.m_backend.fpclass;
                  local_dc8.prec_elem = result_1.m_backend.prec_elem;
                  tVar4 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_dc8,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&degeneps.m_backend);
                  if (tVar4) {
                    iVar6 = (*(this->
                              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._vptr_SPxRatioTester[3])(this);
                    local_738.fpclass = cpp_dec_float_finite;
                    local_738.prec_elem = 0x1c;
                    local_738.data._M_elems[0x18] = 0;
                    local_738.data._M_elems[0x19] = 0;
                    local_738.data._M_elems._104_5_ = 0;
                    local_738.data._M_elems[0x14] = 0;
                    local_738.data._M_elems[0x15] = 0;
                    local_738.data._M_elems[0x16] = 0;
                    local_738.data._M_elems[0x17] = 0;
                    local_738.data._M_elems[0x10] = 0;
                    local_738.data._M_elems[0x11] = 0;
                    local_738.data._M_elems[0x12] = 0;
                    local_738.data._M_elems[0x13] = 0;
                    local_738.data._M_elems[0xc] = 0;
                    local_738.data._M_elems[0xd] = 0;
                    local_738.data._M_elems[0xe] = 0;
                    local_738.data._M_elems[0xf] = 0;
                    local_738.data._M_elems[8] = 0;
                    local_738.data._M_elems[9] = 0;
                    local_738.data._M_elems[10] = 0;
                    local_738.data._M_elems[0xb] = 0;
                    local_738.data._M_elems[4] = 0;
                    local_738.data._M_elems[5] = 0;
                    local_738.data._M_elems[6] = 0;
                    local_738.data._M_elems[7] = 0;
                    local_738.data._M_elems[0] = 0;
                    local_738.data._M_elems[1] = 0;
                    local_738.data._M_elems[2] = 0;
                    local_738.data._M_elems[3] = 0;
                    local_738.data._M_elems[0x1b]._1_3_ = 0;
                    local_738.exp = 0;
                    local_738.neg = false;
                    boost::multiprecision::default_ops::
                    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              (&local_738,(cpp_dec_float<200U,_int,_void> *)(lVar13 + *plVar2),
                               &degeneps.m_backend);
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_12,iVar6),uVar1,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_738);
                  }
                  else {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                              (&local_dc8,&local_e58);
                    tVar4 = boost::multiprecision::operator<=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_dc8,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_9b8);
                    lVar12 = 0x1c;
                    if (tVar4) {
                      pcVar18 = &local_e58;
                      pnVar16 = &result_1;
                      for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                        (pnVar16->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
                        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
                      }
                      result_1.m_backend.exp = local_e58.exp;
                      result_1.m_backend.neg = local_e58.neg;
                      result_1.m_backend.fpclass = local_e58.fpclass;
                      result_1.m_backend.prec_elem = local_e58.prec_elem;
                      if (local_e58.fpclass != cpp_dec_float_finite ||
                          result_1.m_backend.data._M_elems[0] != 0) {
                        result_1.m_backend.neg = (bool)(local_e58.neg ^ 1);
                      }
                      tVar4 = boost::multiprecision::operator>=
                                        (&result_1,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_cc8);
                      if (tVar4) {
                        iVar6 = (*(this->
                                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._vptr_SPxRatioTester[3])(this);
                        enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(extraout_var_14,iVar6),uVar1);
                        pcVar18 = &local_dc8;
                        pcVar15 = &local_d48;
                        for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                          (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                          pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                          pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
                        }
                        local_d48.exp = local_dc8.exp;
                        local_d48.neg = local_dc8.neg;
                        local_d48.fpclass = local_dc8.fpclass;
                        local_d48.prec_elem = local_dc8.prec_elem;
                        puVar19 = local_e58.data._M_elems + 1;
                        puVar22 = local_cc8.data._M_elems + 1;
                        for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
                          *puVar22 = *puVar19;
                          puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
                          puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
                        }
                        local_cc8.data._M_elems[0] = local_e58.data._M_elems[0];
                        local_cc8.neg =
                             (bool)((local_e58.data._M_elems[0] != 0 ||
                                    local_e58.fpclass != cpp_dec_float_finite) ^ local_e58.neg);
                        local_cc8.exp = local_e58.exp;
                        local_cc8.fpclass = local_e58.fpclass;
                        local_cc8.prec_elem = local_e58.prec_elem;
                        uVar25 = uVar1;
                      }
                    }
                  }
                }
                else {
                  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_1.m_backend,this_01,uVar1);
                  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::clearNum(this_01,uVar26);
                }
              }
            }
            uVar26 = *(uint *)(local_e68 + 0xa0);
            uVar1 = 0xffffffff;
            while( true ) {
              lVar12 = 0x1c;
              if ((int)uVar26 < 1) break;
              uVar26 = uVar26 - 1;
              iVar6 = *(int *)(*(long *)(local_e68 + 0xa8) + (ulong)uVar26 * 4);
              lVar23 = (long)iVar6;
              SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_1.m_backend,local_e60,iVar6);
              pcVar18 = &result_1.m_backend;
              pcVar15 = &local_e58;
              for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4)
                ;
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
              }
              local_e58.exp = result_1.m_backend.exp;
              local_e58.neg = result_1.m_backend.neg;
              local_e58.fpclass = result_1.m_backend.fpclass;
              local_e58.prec_elem = result_1.m_backend.prec_elem;
              pnVar16 = &local_b38;
              tVar4 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_e58,pnVar16);
              pcVar18 = &result_1.m_backend;
              if (tVar4) {
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_1.m_backend,
                           (cpp_dec_float<200U,_int,_void> *)(*local_dd0 + lVar23 * 0x80),
                           &(w->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend);
                pcVar15 = &local_dc8;
                for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                }
                local_dc8.exp = result_1.m_backend.exp;
                local_dc8.neg = result_1.m_backend.neg;
                local_dc8.fpclass = result_1.m_backend.fpclass;
                local_dc8.prec_elem = result_1.m_backend.prec_elem;
                pnVar16 = &degeneps;
                pcVar18 = &result_1.m_backend;
                for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar18->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
                  pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                }
                result_1.m_backend.exp = degeneps.m_backend.exp;
                result_1.m_backend.neg = degeneps.m_backend.neg;
                result_1.m_backend.fpclass = degeneps.m_backend.fpclass;
                result_1.m_backend.prec_elem = degeneps.m_backend.prec_elem;
                if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
                    result_1.m_backend.data._M_elems[0] != 0) {
                  result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                }
                tVar4 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_dc8,&result_1);
                if (tVar4) {
                  iVar7 = (*(this->
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._vptr_SPxRatioTester[3])(this);
                  local_7b8.fpclass = cpp_dec_float_finite;
                  local_7b8.prec_elem = 0x1c;
                  local_7b8.data._M_elems[0x18] = 0;
                  local_7b8.data._M_elems[0x19] = 0;
                  local_7b8.data._M_elems._104_5_ = 0;
                  local_7b8.data._M_elems[0x14] = 0;
                  local_7b8.data._M_elems[0x15] = 0;
                  local_7b8.data._M_elems[0x16] = 0;
                  local_7b8.data._M_elems[0x17] = 0;
                  local_7b8.data._M_elems[0x10] = 0;
                  local_7b8.data._M_elems[0x11] = 0;
                  local_7b8.data._M_elems[0x12] = 0;
                  local_7b8.data._M_elems[0x13] = 0;
                  local_7b8.data._M_elems[0xc] = 0;
                  local_7b8.data._M_elems[0xd] = 0;
                  local_7b8.data._M_elems[0xe] = 0;
                  local_7b8.data._M_elems[0xf] = 0;
                  local_7b8.data._M_elems[8] = 0;
                  local_7b8.data._M_elems[9] = 0;
                  local_7b8.data._M_elems[10] = 0;
                  local_7b8.data._M_elems[0xb] = 0;
                  local_7b8.data._M_elems[4] = 0;
                  local_7b8.data._M_elems[5] = 0;
                  local_7b8.data._M_elems[6] = 0;
                  local_7b8.data._M_elems[7] = 0;
                  local_7b8.data._M_elems[0] = 0;
                  local_7b8.data._M_elems[1] = 0;
                  local_7b8.data._M_elems[2] = 0;
                  local_7b8.data._M_elems[3] = 0;
                  local_7b8.data._M_elems[0x1b]._1_3_ = 0;
                  local_7b8.exp = 0;
                  local_7b8.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&local_7b8,
                             &(w->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend,
                             &degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_15,iVar7),iVar6,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_7b8);
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                            (&local_dc8,&local_e58);
                  tVar4 = boost::multiprecision::operator<=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_dc8,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_9b8);
                  if ((tVar4) &&
                     (tVar4 = boost::multiprecision::operator>=
                                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_e58,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_cc8), tVar4)) {
                    iVar7 = (*(this->
                              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._vptr_SPxRatioTester[3])(this);
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_17,iVar7),iVar6);
                    pcVar18 = &local_dc8;
                    pcVar15 = &local_d48;
                    for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                      (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                      pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                      pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
                    }
                    local_d48.exp = local_dc8.exp;
                    local_d48.neg = local_dc8.neg;
                    local_d48.fpclass = local_dc8.fpclass;
                    local_d48.prec_elem = local_dc8.prec_elem;
                    pcVar18 = &local_e58;
                    pcVar15 = &local_cc8;
                    for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                      (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                      pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                      pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                    }
                    local_cc8.exp = local_e58.exp;
                    local_cc8.neg = local_e58.neg;
                    local_cc8.fpclass = local_e58.fpclass;
                    local_cc8.prec_elem = local_e58.prec_elem;
                    uVar1 = uVar26;
                  }
                }
              }
              else {
                for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                  (pcVar18->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
                  pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                }
                result_1.m_backend.exp = local_b38.m_backend.exp;
                result_1.m_backend.neg = local_b38.m_backend.neg;
                result_1.m_backend.fpclass = local_b38.m_backend.fpclass;
                result_1.m_backend.prec_elem = local_b38.m_backend.prec_elem;
                if (local_b38.m_backend.fpclass != cpp_dec_float_finite ||
                    result_1.m_backend.data._M_elems[0] != 0) {
                  result_1.m_backend.neg = (bool)(local_b38.m_backend.neg ^ 1);
                }
                tVar4 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_e58,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&result_1.m_backend);
                this_00 = local_e60;
                if (tVar4) {
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 0x1c;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems[8] = 0;
                  result_1.m_backend.data._M_elems[9] = 0;
                  result_1.m_backend.data._M_elems[10] = 0;
                  result_1.m_backend.data._M_elems[0xb] = 0;
                  result_1.m_backend.data._M_elems[0xc] = 0;
                  result_1.m_backend.data._M_elems[0xd] = 0;
                  result_1.m_backend.data._M_elems[0xe] = 0;
                  result_1.m_backend.data._M_elems[0xf] = 0;
                  result_1.m_backend.data._M_elems[0x10] = 0;
                  result_1.m_backend.data._M_elems[0x11] = 0;
                  result_1.m_backend.data._M_elems[0x12] = 0;
                  result_1.m_backend.data._M_elems[0x13] = 0;
                  result_1.m_backend.data._M_elems[0x14] = 0;
                  result_1.m_backend.data._M_elems[0x15] = 0;
                  result_1.m_backend.data._M_elems[0x16] = 0;
                  result_1.m_backend.data._M_elems[0x17] = 0;
                  result_1.m_backend.data._M_elems[0x18] = 0;
                  result_1.m_backend.data._M_elems[0x19] = 0;
                  result_1.m_backend.data._M_elems._104_5_ = 0;
                  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&result_1.m_backend,
                             (cpp_dec_float<200U,_int,_void> *)(*local_dd8 + lVar23 * 0x80),
                             &(w->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend);
                  pcVar18 = &result_1.m_backend;
                  pcVar15 = &local_dc8;
                  for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                    pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                  }
                  local_dc8.exp = result_1.m_backend.exp;
                  local_dc8.neg = result_1.m_backend.neg;
                  local_dc8.fpclass = result_1.m_backend.fpclass;
                  local_dc8.prec_elem = result_1.m_backend.prec_elem;
                  tVar4 = boost::multiprecision::operator>
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_dc8,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&degeneps.m_backend);
                  if (tVar4) {
                    iVar7 = (*(this->
                              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._vptr_SPxRatioTester[3])(this);
                    local_838.fpclass = cpp_dec_float_finite;
                    local_838.prec_elem = 0x1c;
                    local_838.data._M_elems[0x18] = 0;
                    local_838.data._M_elems[0x19] = 0;
                    local_838.data._M_elems._104_5_ = 0;
                    local_838.data._M_elems[0x14] = 0;
                    local_838.data._M_elems[0x15] = 0;
                    local_838.data._M_elems[0x16] = 0;
                    local_838.data._M_elems[0x17] = 0;
                    local_838.data._M_elems[0x10] = 0;
                    local_838.data._M_elems[0x11] = 0;
                    local_838.data._M_elems[0x12] = 0;
                    local_838.data._M_elems[0x13] = 0;
                    local_838.data._M_elems[0xc] = 0;
                    local_838.data._M_elems[0xd] = 0;
                    local_838.data._M_elems[0xe] = 0;
                    local_838.data._M_elems[0xf] = 0;
                    local_838.data._M_elems[8] = 0;
                    local_838.data._M_elems[9] = 0;
                    local_838.data._M_elems[10] = 0;
                    local_838.data._M_elems[0xb] = 0;
                    local_838.data._M_elems[4] = 0;
                    local_838.data._M_elems[5] = 0;
                    local_838.data._M_elems[6] = 0;
                    local_838.data._M_elems[7] = 0;
                    local_838.data._M_elems[0] = 0;
                    local_838.data._M_elems[1] = 0;
                    local_838.data._M_elems[2] = 0;
                    local_838.data._M_elems[3] = 0;
                    local_838.data._M_elems[0x1b]._1_3_ = 0;
                    local_838.exp = 0;
                    local_838.neg = false;
                    boost::multiprecision::default_ops::
                    eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                              (&local_838,
                               &(w->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend,
                               &degeneps.m_backend);
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_16,iVar7),iVar6,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_838);
                  }
                  else {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                              (&local_dc8,&local_e58);
                    tVar4 = boost::multiprecision::operator<=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_dc8,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_9b8);
                    lVar12 = 0x1c;
                    if (tVar4) {
                      pcVar18 = &local_e58;
                      pnVar16 = &result_1;
                      for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                        (pnVar16->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
                        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
                      }
                      result_1.m_backend.exp = local_e58.exp;
                      result_1.m_backend.neg = local_e58.neg;
                      result_1.m_backend.fpclass = local_e58.fpclass;
                      result_1.m_backend.prec_elem = local_e58.prec_elem;
                      if (local_e58.fpclass != cpp_dec_float_finite ||
                          result_1.m_backend.data._M_elems[0] != 0) {
                        result_1.m_backend.neg = (bool)(local_e58.neg ^ 1);
                      }
                      tVar4 = boost::multiprecision::operator>=
                                        (&result_1,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_cc8);
                      if (tVar4) {
                        iVar7 = (*(this->
                                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._vptr_SPxRatioTester[3])(this);
                        enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)CONCAT44(extraout_var_18,iVar7),iVar6);
                        pcVar18 = &local_dc8;
                        pcVar15 = &local_d48;
                        for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                          (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                          pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                          pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
                        }
                        local_d48.exp = local_dc8.exp;
                        local_d48.neg = local_dc8.neg;
                        local_d48.fpclass = local_dc8.fpclass;
                        local_d48.prec_elem = local_dc8.prec_elem;
                        puVar19 = local_e58.data._M_elems + 1;
                        puVar22 = local_cc8.data._M_elems + 1;
                        for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
                          *puVar22 = *puVar19;
                          puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
                          puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
                        }
                        local_cc8.data._M_elems[0] = local_e58.data._M_elems[0];
                        local_cc8.neg =
                             (bool)((local_e58.data._M_elems[0] != 0 ||
                                    local_e58.fpclass != cpp_dec_float_finite) ^ local_e58.neg);
                        local_cc8.exp = local_e58.exp;
                        local_cc8.fpclass = local_e58.fpclass;
                        local_cc8.prec_elem = local_e58.prec_elem;
                        uVar1 = uVar26;
                      }
                    }
                  }
                }
                else {
                  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_1.m_backend,local_e60,iVar6);
                  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::clearNum(this_00,uVar26);
                }
              }
            }
            iVar6 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])(this);
            (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar6) + 0x368))
                      (&result_1,(long *)CONCAT44(extraout_var_19,iVar6));
            bVar5 = boost::multiprecision::operator==(&local_a38,&result_1);
            val = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_e80;
          } while (!bVar5);
          if ((int)uVar1 < 0) break;
          iVar6 = (*(this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SPxRatioTester[3])();
          bVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(extraout_var_20,iVar6),&enterId);
          if (!bVar5) goto LAB_0044bcb1;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::clearNum(local_e60,uVar1);
        }
        if ((int)uVar25 < 0) goto LAB_0044bcf6;
        iVar6 = (*(this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxRatioTester[3])(this);
        lVar13 = *(long *)(CONCAT44(extraout_var_21,iVar6) + 0xc58);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator*(&result_1,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)*(int *)(*(long *)(lVar13 + 0x28) + 4 + (ulong)uVar25 * 8) * 0x28 +
                       *(long *)(lVar13 + 0x20)),w);
        lVar13 = *plVar2;
        lVar24 = (ulong)uVar25 * 0x80;
        pnVar16 = &result_1;
        puVar19 = (uint *)(lVar13 + lVar24);
        for (lVar23 = lVar12; lVar23 != 0; lVar23 = lVar23 + -1) {
          *puVar19 = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
          puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
        }
        *(int *)(lVar13 + 0x70 + lVar24) = result_1.m_backend.exp;
        *(bool *)(lVar13 + 0x74 + lVar24) = result_1.m_backend.neg;
        *(undefined8 *)(lVar13 + 0x78 + lVar24) = result_1.m_backend._120_8_;
        iVar6 = (*(this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxRatioTester[3])(this);
        bVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(extraout_var_22,iVar6),&enterId);
        if (!bVar5) break;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_b0,0.0,(type *)0x0);
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::setValue(this_01,uVar25,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_b0);
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[](&result_1,this_01,uVar25);
      pnVar16 = &result_1;
      pcVar18 = &local_e58;
      for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar18->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
        pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      local_e58.exp = result_1.m_backend.exp;
      local_e58.neg = result_1.m_backend.neg;
      local_e58.fpclass = result_1.m_backend.fpclass;
      local_e58.prec_elem = result_1.m_backend.prec_elem;
      result_1.m_backend.data._M_elems._0_8_ =
           result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e58,(int *)&result_1);
      if (tVar4) {
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(*local_e70 + lVar24),
                   (cpp_dec_float<200U,_int,_void> *)(*plVar2 + lVar24));
        pcVar18 = &result_1.m_backend;
        pcVar15 = &local_d48;
        for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
          (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0] =
               (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4)
          ;
        }
        local_d48.exp = result_1.m_backend.exp;
        local_d48.neg = result_1.m_backend.neg;
        local_d48.fpclass = result_1.m_backend.fpclass;
        local_d48.prec_elem = result_1.m_backend.prec_elem;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_e58,&minStability);
        if ((tVar4) &&
           (tVar4 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_d48,local_c40), tVar4)) {
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0x40000000;
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                    (&minStability.m_backend,(double *)&result_1);
          iVar6 = (*(this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SPxRatioTester[3])();
          lVar13 = *plVar2;
          puVar19 = (uint *)(lVar13 + lVar24);
          pnVar16 = &local_1b0;
          for (; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pnVar16->m_backend).data._M_elems[0] = *puVar19;
            puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_1b0.m_backend.exp = *(int *)(lVar13 + 0x70 + lVar24);
          local_1b0.m_backend.neg = *(bool *)(lVar13 + 0x74 + lVar24);
          local_1b0.m_backend._120_8_ = *(undefined8 *)(lVar13 + 0x78 + lVar24);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_23,iVar6),uVar25,&local_1b0);
          goto LAB_00448f18;
        }
      }
      else {
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 0x1c;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems[6] = 0;
        result_1.m_backend.data._M_elems[7] = 0;
        result_1.m_backend.data._M_elems[8] = 0;
        result_1.m_backend.data._M_elems[9] = 0;
        result_1.m_backend.data._M_elems[10] = 0;
        result_1.m_backend.data._M_elems[0xb] = 0;
        result_1.m_backend.data._M_elems[0xc] = 0;
        result_1.m_backend.data._M_elems[0xd] = 0;
        result_1.m_backend.data._M_elems[0xe] = 0;
        result_1.m_backend.data._M_elems[0xf] = 0;
        result_1.m_backend.data._M_elems[0x10] = 0;
        result_1.m_backend.data._M_elems[0x11] = 0;
        result_1.m_backend.data._M_elems[0x12] = 0;
        result_1.m_backend.data._M_elems[0x13] = 0;
        result_1.m_backend.data._M_elems[0x14] = 0;
        result_1.m_backend.data._M_elems[0x15] = 0;
        result_1.m_backend.data._M_elems[0x16] = 0;
        result_1.m_backend.data._M_elems[0x17] = 0;
        result_1.m_backend.data._M_elems[0x18] = 0;
        result_1.m_backend.data._M_elems[0x19] = 0;
        result_1.m_backend.data._M_elems._104_5_ = 0;
        result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(*local_e78 + lVar24),
                   (cpp_dec_float<200U,_int,_void> *)(*plVar2 + lVar24));
        pcVar18 = &result_1.m_backend;
        pcVar15 = &local_d48;
        for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4)
          ;
        }
        local_d48.exp = result_1.m_backend.exp;
        local_d48.neg = result_1.m_backend.neg;
        local_d48.fpclass = result_1.m_backend.fpclass;
        local_d48.prec_elem = result_1.m_backend.prec_elem;
        pcVar18 = &local_e58;
        pcVar15 = &result_1.m_backend;
        for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
          (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar27 * -2 + 1) * 4)
          ;
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar27 * -8 + 4);
        }
        result_1.m_backend.exp = local_e58.exp;
        result_1.m_backend.neg = local_e58.neg;
        result_1.m_backend.fpclass = local_e58.fpclass;
        result_1.m_backend.prec_elem = local_e58.prec_elem;
        if (local_e58.fpclass != cpp_dec_float_finite || result_1.m_backend.data._M_elems[0] != 0) {
          result_1.m_backend.neg = (bool)(local_e58.neg ^ 1);
        }
        tVar4 = boost::multiprecision::operator<(&result_1,&minStability);
        if (tVar4) {
          pcVar18 = &local_d48;
          pnVar16 = &result;
          for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pnVar16->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar18 + ((ulong)bVar27 * -2 + 1) * 4);
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          result.m_backend.exp = local_d48.exp;
          result.m_backend.neg = local_d48.neg;
          result.m_backend.fpclass = local_d48.fpclass;
          result.m_backend.prec_elem = local_d48.prec_elem;
          if (local_d48.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
            result.m_backend.neg = (bool)(local_d48.neg ^ 1);
          }
          tVar4 = boost::multiprecision::operator<(&result,local_c40);
          if (tVar4) {
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0x40000000;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                      (&minStability.m_backend,(double *)&result_1);
            iVar6 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])();
            lVar13 = *plVar2;
            puVar19 = (uint *)(lVar13 + lVar24);
            pnVar16 = &local_230;
            for (; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar16->m_backend).data._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
              pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_230.m_backend.exp = *(int *)(lVar13 + 0x70 + lVar24);
            local_230.m_backend.neg = *(bool *)(lVar13 + 0x74 + lVar24);
            local_230.m_backend._120_8_ = *(undefined8 *)(lVar13 + 0x78 + lVar24);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_24,iVar6),uVar25,&local_230);
            goto LAB_00448f18;
          }
        }
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                (&local_d48,&local_e58);
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_d48,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_9b8);
    } while (tVar4);
  }
  else {
    pnVar16 = &epsilon;
    pnVar17 = &result_1;
    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar27 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    result_1.m_backend.exp = epsilon.m_backend.exp;
    result_1.m_backend.neg = epsilon.m_backend.neg;
    result_1.m_backend.fpclass = epsilon.m_backend.fpclass;
    result_1.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    if (epsilon.m_backend.fpclass != cpp_dec_float_finite ||
        result_1.m_backend.data._M_elems[0] != 0) {
      result_1.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
    }
    tVar4 = boost::multiprecision::operator<(val,&result_1);
    if (tVar4) {
      pnVar16 = &(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta;
LAB_0044a74d:
      do {
        while( true ) {
          do {
            lVar13 = 0x1c;
            lVar12 = lVar13;
            pcVar18 = &val->m_backend;
            pcVar15 = &local_9b8;
            for (; lVar12 != 0; lVar12 = lVar12 + -1) {
              (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0] =
                   (((cpp_dec_float<200U,_int,_void> *)&pcVar18->data)->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_9b8.exp = (val->m_backend).exp;
            local_9b8.neg = (val->m_backend).neg;
            local_9b8.fpclass = (val->m_backend).fpclass;
            local_9b8.prec_elem = (val->m_backend).prec_elem;
            iVar6 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])(this);
            (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar6) + 0x368))
                      (&result_1.m_backend,(long *)CONCAT44(extraout_var_25,iVar6));
            pcVar18 = &result_1.m_backend;
            pnVar17 = &local_a38;
            for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + (ulong)bVar27 * -8 + 4);
            }
            local_a38.m_backend.exp = result_1.m_backend.exp;
            local_a38.m_backend.neg = result_1.m_backend.neg;
            local_a38.m_backend.fpclass = result_1.m_backend.fpclass;
            local_a38.m_backend.prec_elem = result_1.m_backend.prec_elem;
            minDelta(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&rmaxabs.m_backend,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_9b8,*(int *)(lVar14 + 0xa0),*(int **)(lVar14 + 0xa8),
                     *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       **)(lVar14 + 0xb8),
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*plVar2,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*local_e78,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*local_e70);
            minDelta(this,&cmaxabs,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_9b8,*(int *)(local_e68 + 0xa0),*(int **)(local_e68 + 0xa8),
                     *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       **)(local_e68 + 0xb8),
                     (w->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*local_dd8,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)*local_dd0);
            bVar5 = boost::multiprecision::operator==
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_9b8,val);
            if (bVar5) {
              uVar9._0_4_ = enterId.super_DataKey.info;
              uVar9._4_4_ = enterId.super_DataKey.idx;
              return (SPxId)uVar9;
            }
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(&local_cc8,0)
            ;
            pdVar8 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                      (&result_1.m_backend,*pdVar8,(type *)0x0);
            pcVar18 = &result_1.m_backend;
            pcVar15 = &local_d48;
            for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_d48.exp = result_1.m_backend.exp;
            local_d48.neg = result_1.m_backend.neg;
            local_d48.fpclass = result_1.m_backend.fpclass;
            local_d48.prec_elem = result_1.m_backend.prec_elem;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,&rmaxabs.m_backend,&epsilon.m_backend);
            local_e88 = 0.001;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                      (&result_1.m_backend,&result.m_backend,&local_e88);
            pcVar18 = &result_1.m_backend;
            pnVar17 = &local_bb8;
            for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_bb8.m_backend.exp = result_1.m_backend.exp;
            local_bb8.m_backend.neg = result_1.m_backend.neg;
            local_bb8.m_backend.fpclass = result_1.m_backend.fpclass;
            local_bb8.m_backend.prec_elem = result_1.m_backend.prec_elem;
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x1c;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems[0xe] = 0;
            result.m_backend.data._M_elems[0xf] = 0;
            result.m_backend.data._M_elems[0x10] = 0;
            result.m_backend.data._M_elems[0x11] = 0;
            result.m_backend.data._M_elems[0x12] = 0;
            result.m_backend.data._M_elems[0x13] = 0;
            result.m_backend.data._M_elems[0x14] = 0;
            result.m_backend.data._M_elems[0x15] = 0;
            result.m_backend.data._M_elems[0x16] = 0;
            result.m_backend.data._M_elems[0x17] = 0;
            result.m_backend.data._M_elems[0x18] = 0;
            result.m_backend.data._M_elems[0x19] = 0;
            result.m_backend.data._M_elems._104_5_ = 0;
            result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result.m_backend,&cmaxabs.m_backend,&epsilon.m_backend);
            local_e88 = 0.001;
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                      (&result_1.m_backend,&result.m_backend,&local_e88);
            pcVar18 = &result_1.m_backend;
            pnVar17 = &local_b38;
            for (; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_b38.m_backend.exp = result_1.m_backend.exp;
            local_b38.m_backend.neg = result_1.m_backend.neg;
            local_b38.m_backend.fpclass = result_1.m_backend.fpclass;
            local_b38.m_backend.prec_elem = result_1.m_backend.prec_elem;
            uVar26 = *(uint *)(lVar14 + 0xa0);
            uVar25 = 0xffffffff;
            while( true ) {
              lVar12 = 0x1c;
              if ((int)uVar26 < 1) break;
              uVar26 = uVar26 - 1;
              uVar1 = *(uint *)(*(long *)(lVar14 + 0xa8) + (ulong)uVar26 * 4);
              SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_1.m_backend,this_01,uVar1);
              pcVar18 = &result_1.m_backend;
              pcVar15 = &local_e58;
              for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0] =
                     (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4)
                ;
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
              }
              local_e58.exp = result_1.m_backend.exp;
              local_e58.neg = result_1.m_backend.neg;
              local_e58.fpclass = result_1.m_backend.fpclass;
              local_e58.prec_elem = result_1.m_backend.prec_elem;
              pnVar17 = &local_bb8;
              tVar4 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_e58,pnVar17);
              lVar13 = lVar12;
              pcVar18 = &result_1.m_backend;
              if (tVar4) {
                lVar23 = (long)(int)uVar1 * 0x80;
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_1.m_backend,
                           (cpp_dec_float<200U,_int,_void> *)(*local_e78 + lVar23),
                           (cpp_dec_float<200U,_int,_void> *)(*plVar2 + lVar23));
                pcVar15 = &local_dc8;
                for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                }
                local_dc8.exp = result_1.m_backend.exp;
                local_dc8.neg = result_1.m_backend.neg;
                local_dc8.fpclass = result_1.m_backend.fpclass;
                local_dc8.prec_elem = result_1.m_backend.prec_elem;
                tVar4 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_dc8,&degeneps);
                if (tVar4) {
                  iVar6 = (*(this->
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._vptr_SPxRatioTester[3])();
                  lVar13 = *plVar2;
                  puVar19 = (uint *)(lVar13 + lVar23);
                  pnVar17 = &local_2b0;
                  for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pnVar17->m_backend).data._M_elems[0] = *puVar19;
                    puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
                    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                  }
                  local_2b0.m_backend.exp = *(int *)(lVar13 + 0x70 + lVar23);
                  local_2b0.m_backend.neg = *(bool *)(lVar13 + 0x74 + lVar23);
                  local_2b0.m_backend._120_8_ = *(undefined8 *)(lVar13 + 0x78 + lVar23);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_26,iVar6),uVar1,&local_2b0);
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                            (&local_dc8,&local_e58);
                  tVar4 = boost::multiprecision::operator>=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_dc8,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_9b8);
                  if (tVar4) {
                    tVar4 = boost::multiprecision::operator>
                                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_e58,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_cc8);
                    lVar12 = 0x1c;
                    if (tVar4) {
                      iVar6 = (*(this->
                                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_28,iVar6),uVar1);
                      pcVar18 = &local_dc8;
                      pcVar15 = &local_d48;
                      for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                        (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                        pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
                      }
                      local_d48.exp = local_dc8.exp;
                      local_d48.neg = local_dc8.neg;
                      local_d48.fpclass = local_dc8.fpclass;
                      local_d48.prec_elem = local_dc8.prec_elem;
                      pcVar18 = &local_e58;
                      pcVar15 = &local_cc8;
                      for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                        (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                        pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                      }
                      local_cc8.exp = local_e58.exp;
                      local_cc8.neg = local_e58.neg;
                      local_cc8.fpclass = local_e58.fpclass;
                      local_cc8.prec_elem = local_e58.prec_elem;
                      uVar25 = uVar1;
                    }
                  }
                }
              }
              else {
                for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar18->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
                  pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                }
                result_1.m_backend.exp = local_bb8.m_backend.exp;
                result_1.m_backend.neg = local_bb8.m_backend.neg;
                result_1.m_backend.fpclass = local_bb8.m_backend.fpclass;
                result_1.m_backend.prec_elem = local_bb8.m_backend.prec_elem;
                if (local_bb8.m_backend.fpclass != cpp_dec_float_finite ||
                    result_1.m_backend.data._M_elems[0] != 0) {
                  result_1.m_backend.neg = (bool)(local_bb8.m_backend.neg ^ 1);
                }
                tVar4 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_e58,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&result_1.m_backend);
                if (tVar4) {
                  lVar23 = (long)(int)uVar1 * 0x80;
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 0x1c;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems[8] = 0;
                  result_1.m_backend.data._M_elems[9] = 0;
                  result_1.m_backend.data._M_elems[10] = 0;
                  result_1.m_backend.data._M_elems[0xb] = 0;
                  result_1.m_backend.data._M_elems[0xc] = 0;
                  result_1.m_backend.data._M_elems[0xd] = 0;
                  result_1.m_backend.data._M_elems[0xe] = 0;
                  result_1.m_backend.data._M_elems[0xf] = 0;
                  result_1.m_backend.data._M_elems[0x10] = 0;
                  result_1.m_backend.data._M_elems[0x11] = 0;
                  result_1.m_backend.data._M_elems[0x12] = 0;
                  result_1.m_backend.data._M_elems[0x13] = 0;
                  result_1.m_backend.data._M_elems[0x14] = 0;
                  result_1.m_backend.data._M_elems[0x15] = 0;
                  result_1.m_backend.data._M_elems[0x16] = 0;
                  result_1.m_backend.data._M_elems[0x17] = 0;
                  result_1.m_backend.data._M_elems[0x18] = 0;
                  result_1.m_backend.data._M_elems[0x19] = 0;
                  result_1.m_backend.data._M_elems._104_5_ = 0;
                  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&result_1.m_backend,
                             (cpp_dec_float<200U,_int,_void> *)(*local_e70 + lVar23),
                             (cpp_dec_float<200U,_int,_void> *)(*plVar2 + lVar23));
                  pcVar18 = &result_1.m_backend;
                  pcVar15 = &local_dc8;
                  for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                    (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                    pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                  }
                  local_dc8.exp = result_1.m_backend.exp;
                  local_dc8.neg = result_1.m_backend.neg;
                  local_dc8.fpclass = result_1.m_backend.fpclass;
                  local_dc8.prec_elem = result_1.m_backend.prec_elem;
                  pnVar17 = &degeneps;
                  pcVar18 = &result_1.m_backend;
                  for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pcVar18->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
                    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                    pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                  }
                  result_1.m_backend.exp = degeneps.m_backend.exp;
                  result_1.m_backend.neg = degeneps.m_backend.neg;
                  result_1.m_backend.fpclass = degeneps.m_backend.fpclass;
                  result_1.m_backend.prec_elem = degeneps.m_backend.prec_elem;
                  if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
                      result_1.m_backend.data._M_elems[0] != 0) {
                    result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                  }
                  tVar4 = boost::multiprecision::operator<
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_dc8,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&result_1.m_backend);
                  if (tVar4) {
                    iVar6 = (*(this->
                              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._vptr_SPxRatioTester[3])();
                    lVar12 = *plVar2;
                    puVar19 = (uint *)(lVar12 + lVar23);
                    pnVar17 = &local_330;
                    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
                      (pnVar17->m_backend).data._M_elems[0] = *puVar19;
                      puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
                      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                    }
                    local_330.m_backend.exp = *(int *)(lVar12 + 0x70 + lVar23);
                    local_330.m_backend.neg = *(bool *)(lVar12 + 0x74 + lVar23);
                    local_330.m_backend._120_8_ = *(undefined8 *)(lVar12 + 0x78 + lVar23);
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_27,iVar6),uVar1,&local_330);
                  }
                  else {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                              (&local_dc8,&local_e58);
                    tVar4 = boost::multiprecision::operator>=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_dc8,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_9b8);
                    if (tVar4) {
                      lVar12 = 0x1c;
                      pcVar18 = &local_e58;
                      pnVar17 = &result_1;
                      for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                        (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
                        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                      }
                      result_1.m_backend.exp = local_e58.exp;
                      result_1.m_backend.neg = local_e58.neg;
                      result_1.m_backend.fpclass = local_e58.fpclass;
                      result_1.m_backend.prec_elem = local_e58.prec_elem;
                      if (local_e58.fpclass != cpp_dec_float_finite ||
                          result_1.m_backend.data._M_elems[0] != 0) {
                        result_1.m_backend.neg = (bool)(local_e58.neg ^ 1);
                      }
                      tVar4 = boost::multiprecision::operator>
                                        (&result_1,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_cc8);
                      if (tVar4) {
                        iVar6 = (*(this->
                                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._vptr_SPxRatioTester[3])();
                        enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(extraout_var_29,iVar6),uVar1);
                        pcVar18 = &local_dc8;
                        pcVar15 = &local_d48;
                        for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                          (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                          pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                          pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
                        }
                        local_d48.exp = local_dc8.exp;
                        local_d48.neg = local_dc8.neg;
                        local_d48.fpclass = local_dc8.fpclass;
                        local_d48.prec_elem = local_dc8.prec_elem;
                        puVar19 = local_e58.data._M_elems + 1;
                        puVar22 = local_cc8.data._M_elems + 1;
                        for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
                          *puVar22 = *puVar19;
                          puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
                          puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
                        }
                        local_cc8.data._M_elems[0] = local_e58.data._M_elems[0];
                        local_cc8.neg =
                             (bool)((local_e58.data._M_elems[0] != 0 ||
                                    local_e58.fpclass != cpp_dec_float_finite) ^ local_e58.neg);
                        local_cc8.exp = local_e58.exp;
                        local_cc8.fpclass = local_e58.fpclass;
                        local_cc8.prec_elem = local_e58.prec_elem;
                        uVar25 = uVar1;
                      }
                    }
                  }
                }
                else {
                  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_1.m_backend,this_01,uVar1);
                  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::clearNum(this_01,uVar26);
                }
              }
            }
            uVar26 = *(uint *)(local_e68 + 0xa0);
            local_f5c = 0xffffffff;
            while( true ) {
              lVar12 = 0x1c;
              if ((int)uVar26 < 1) break;
              uVar26 = uVar26 - 1;
              iVar6 = *(int *)(*(long *)(local_e68 + 0xa8) + (ulong)uVar26 * 4);
              lVar23 = (long)iVar6;
              SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_1.m_backend,local_e60,iVar6);
              pcVar18 = &result_1.m_backend;
              pcVar15 = &local_e58;
              for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0] =
                     (pcVar18->data)._M_elems[0];
                pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4)
                ;
                pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
              }
              local_e58.exp = result_1.m_backend.exp;
              local_e58.neg = result_1.m_backend.neg;
              local_e58.fpclass = result_1.m_backend.fpclass;
              local_e58.prec_elem = result_1.m_backend.prec_elem;
              pnVar17 = &local_b38;
              tVar4 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_e58,pnVar17);
              lVar13 = lVar12;
              pcVar18 = &result_1.m_backend;
              if (tVar4) {
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 0x1c;
                result_1.m_backend.data._M_elems[0] = 0;
                result_1.m_backend.data._M_elems[1] = 0;
                result_1.m_backend.data._M_elems[2] = 0;
                result_1.m_backend.data._M_elems[3] = 0;
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems[6] = 0;
                result_1.m_backend.data._M_elems[7] = 0;
                result_1.m_backend.data._M_elems[8] = 0;
                result_1.m_backend.data._M_elems[9] = 0;
                result_1.m_backend.data._M_elems[10] = 0;
                result_1.m_backend.data._M_elems[0xb] = 0;
                result_1.m_backend.data._M_elems[0xc] = 0;
                result_1.m_backend.data._M_elems[0xd] = 0;
                result_1.m_backend.data._M_elems[0xe] = 0;
                result_1.m_backend.data._M_elems[0xf] = 0;
                result_1.m_backend.data._M_elems[0x10] = 0;
                result_1.m_backend.data._M_elems[0x11] = 0;
                result_1.m_backend.data._M_elems[0x12] = 0;
                result_1.m_backend.data._M_elems[0x13] = 0;
                result_1.m_backend.data._M_elems[0x14] = 0;
                result_1.m_backend.data._M_elems[0x15] = 0;
                result_1.m_backend.data._M_elems[0x16] = 0;
                result_1.m_backend.data._M_elems[0x17] = 0;
                result_1.m_backend.data._M_elems[0x18] = 0;
                result_1.m_backend.data._M_elems[0x19] = 0;
                result_1.m_backend.data._M_elems._104_5_ = 0;
                result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                          (&result_1.m_backend,
                           (cpp_dec_float<200U,_int,_void> *)(*local_dd8 + lVar23 * 0x80),
                           &(w->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend);
                pcVar15 = &local_dc8;
                for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                  pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                }
                local_dc8.exp = result_1.m_backend.exp;
                local_dc8.neg = result_1.m_backend.neg;
                local_dc8.fpclass = result_1.m_backend.fpclass;
                local_dc8.prec_elem = result_1.m_backend.prec_elem;
                tVar4 = boost::multiprecision::operator>
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_dc8,&degeneps);
                if (tVar4) {
                  iVar7 = (*(this->
                            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._vptr_SPxRatioTester[3])();
                  pnVar3 = (w->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pnVar20 = pnVar3 + lVar23;
                  pnVar17 = &local_3b0;
                  for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pnVar17->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                    pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar27 * -2 + 1) * 4);
                    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                  }
                  local_3b0.m_backend.exp = pnVar3[lVar23].m_backend.exp;
                  local_3b0.m_backend.neg = pnVar3[lVar23].m_backend.neg;
                  local_3b0.m_backend.fpclass = pnVar3[lVar23].m_backend.fpclass;
                  local_3b0.m_backend.prec_elem = pnVar3[lVar23].m_backend.prec_elem;
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_30,iVar7),iVar6,&local_3b0);
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                            (&local_dc8,&local_e58);
                  tVar4 = boost::multiprecision::operator>=
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_dc8,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_9b8);
                  if (tVar4) {
                    tVar4 = boost::multiprecision::operator>
                                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_e58,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_cc8);
                    lVar12 = 0x1c;
                    if (tVar4) {
                      iVar7 = (*(this->
                                super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._vptr_SPxRatioTester[3])();
                      enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(extraout_var_32,iVar7),iVar6);
                      pcVar18 = &local_dc8;
                      pcVar15 = &local_d48;
                      for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                        (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                        pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
                      }
                      local_d48.exp = local_dc8.exp;
                      local_d48.neg = local_dc8.neg;
                      local_d48.fpclass = local_dc8.fpclass;
                      local_d48.prec_elem = local_dc8.prec_elem;
                      pcVar18 = &local_e58;
                      pcVar15 = &local_cc8;
                      for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                        (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                        pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                      }
                      local_cc8.exp = local_e58.exp;
                      local_cc8.neg = local_e58.neg;
                      local_cc8.fpclass = local_e58.fpclass;
                      local_cc8.prec_elem = local_e58.prec_elem;
                      local_f5c = uVar26;
                    }
                  }
                }
              }
              else {
                for (; lVar13 != 0; lVar13 = lVar13 + -1) {
                  (pcVar18->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
                  pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                  pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                }
                result_1.m_backend.exp = local_b38.m_backend.exp;
                result_1.m_backend.neg = local_b38.m_backend.neg;
                result_1.m_backend.fpclass = local_b38.m_backend.fpclass;
                result_1.m_backend.prec_elem = local_b38.m_backend.prec_elem;
                if (local_b38.m_backend.fpclass != cpp_dec_float_finite ||
                    result_1.m_backend.data._M_elems[0] != 0) {
                  result_1.m_backend.neg = (bool)(local_b38.m_backend.neg ^ 1);
                }
                tVar4 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_e58,
                                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&result_1.m_backend);
                if (tVar4) {
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 0x1c;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems[6] = 0;
                  result_1.m_backend.data._M_elems[7] = 0;
                  result_1.m_backend.data._M_elems[8] = 0;
                  result_1.m_backend.data._M_elems[9] = 0;
                  result_1.m_backend.data._M_elems[10] = 0;
                  result_1.m_backend.data._M_elems[0xb] = 0;
                  result_1.m_backend.data._M_elems[0xc] = 0;
                  result_1.m_backend.data._M_elems[0xd] = 0;
                  result_1.m_backend.data._M_elems[0xe] = 0;
                  result_1.m_backend.data._M_elems[0xf] = 0;
                  result_1.m_backend.data._M_elems[0x10] = 0;
                  result_1.m_backend.data._M_elems[0x11] = 0;
                  result_1.m_backend.data._M_elems[0x12] = 0;
                  result_1.m_backend.data._M_elems[0x13] = 0;
                  result_1.m_backend.data._M_elems[0x14] = 0;
                  result_1.m_backend.data._M_elems[0x15] = 0;
                  result_1.m_backend.data._M_elems[0x16] = 0;
                  result_1.m_backend.data._M_elems[0x17] = 0;
                  result_1.m_backend.data._M_elems[0x18] = 0;
                  result_1.m_backend.data._M_elems[0x19] = 0;
                  result_1.m_backend.data._M_elems._104_5_ = 0;
                  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                            (&result_1.m_backend,
                             (cpp_dec_float<200U,_int,_void> *)(*local_dd0 + lVar23 * 0x80),
                             &(w->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar23].m_backend);
                  pcVar18 = &result_1.m_backend;
                  pcVar15 = &local_dc8;
                  for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                    (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                    pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                    pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar15 + (ulong)bVar27 * -8 + 4);
                  }
                  local_dc8.exp = result_1.m_backend.exp;
                  local_dc8.neg = result_1.m_backend.neg;
                  local_dc8.fpclass = result_1.m_backend.fpclass;
                  local_dc8.prec_elem = result_1.m_backend.prec_elem;
                  pnVar17 = &degeneps;
                  pcVar18 = &result_1.m_backend;
                  for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                    (pcVar18->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
                    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                    pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                  }
                  result_1.m_backend.exp = degeneps.m_backend.exp;
                  result_1.m_backend.neg = degeneps.m_backend.neg;
                  result_1.m_backend.fpclass = degeneps.m_backend.fpclass;
                  result_1.m_backend.prec_elem = degeneps.m_backend.prec_elem;
                  if (degeneps.m_backend.fpclass != cpp_dec_float_finite ||
                      result_1.m_backend.data._M_elems[0] != 0) {
                    result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                  }
                  tVar4 = boost::multiprecision::operator<
                                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&local_dc8,
                                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&result_1.m_backend);
                  if (tVar4) {
                    iVar7 = (*(this->
                              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              )._vptr_SPxRatioTester[3])();
                    pnVar3 = (w->val).
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    pnVar20 = pnVar3 + lVar23;
                    pnVar17 = &local_430;
                    for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
                      (pnVar17->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
                      pnVar20 = (pointer)((long)pnVar20 + ((ulong)bVar27 * -2 + 1) * 4);
                      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                    }
                    local_430.m_backend.exp = pnVar3[lVar23].m_backend.exp;
                    local_430.m_backend.neg = pnVar3[lVar23].m_backend.neg;
                    local_430.m_backend.fpclass = pnVar3[lVar23].m_backend.fpclass;
                    local_430.m_backend.prec_elem = pnVar3[lVar23].m_backend.prec_elem;
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_33,iVar7),iVar6,&local_430);
                  }
                  else {
                    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                              (&local_dc8,&local_e58);
                    tVar4 = boost::multiprecision::operator>=
                                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_dc8,
                                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_9b8);
                    lVar12 = 0x1c;
                    if (tVar4) {
                      pcVar18 = &local_e58;
                      pnVar17 = &result_1;
                      for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
                        (pnVar17->m_backend).data._M_elems[0] = (pcVar18->data)._M_elems[0];
                        pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                  ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
                      }
                      result_1.m_backend.exp = local_e58.exp;
                      result_1.m_backend.neg = local_e58.neg;
                      result_1.m_backend.fpclass = local_e58.fpclass;
                      result_1.m_backend.prec_elem = local_e58.prec_elem;
                      if (local_e58.fpclass != cpp_dec_float_finite ||
                          result_1.m_backend.data._M_elems[0] != 0) {
                        result_1.m_backend.neg = (bool)(local_e58.neg ^ 1);
                      }
                      tVar4 = boost::multiprecision::operator>
                                        (&result_1,
                                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_cc8);
                      if (tVar4) {
                        iVar7 = (*(this->
                                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  )._vptr_SPxRatioTester[3])();
                        enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)CONCAT44(extraout_var_31,iVar7),iVar6);
                        pcVar18 = &local_dc8;
                        pcVar15 = &local_d48;
                        for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                          (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
                          pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar18 + (ulong)bVar27 * -8 + 4);
                          pcVar15 = (cpp_dec_float<200U,_int,_void> *)
                                    ((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4);
                        }
                        local_d48.exp = local_dc8.exp;
                        local_d48.neg = local_dc8.neg;
                        local_d48.fpclass = local_dc8.fpclass;
                        local_d48.prec_elem = local_dc8.prec_elem;
                        puVar19 = local_e58.data._M_elems + 1;
                        puVar22 = local_cc8.data._M_elems + 1;
                        for (lVar12 = 0x1b; lVar12 != 0; lVar12 = lVar12 + -1) {
                          *puVar22 = *puVar19;
                          puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
                          puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
                        }
                        local_cc8.data._M_elems[0] = local_e58.data._M_elems[0];
                        local_cc8.neg =
                             (bool)((local_e58.data._M_elems[0] != 0 ||
                                    local_e58.fpclass != cpp_dec_float_finite) ^ local_e58.neg);
                        local_cc8.exp = local_e58.exp;
                        local_cc8.fpclass = local_e58.fpclass;
                        local_cc8.prec_elem = local_e58.prec_elem;
                        local_f5c = uVar26;
                      }
                    }
                  }
                }
                else {
                  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::clearNum(local_e60,uVar26);
                }
              }
            }
            iVar6 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])();
            (**(code **)(*(long *)CONCAT44(extraout_var_34,iVar6) + 0x368))
                      (&result_1.m_backend,(long *)CONCAT44(extraout_var_34,iVar6));
            bVar5 = boost::multiprecision::operator==
                              (&local_a38,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_1.m_backend);
            val = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_e80;
          } while (!bVar5);
          if ((int)local_f5c < 0) break;
          iVar6 = (*(this->
                    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SPxRatioTester[3])();
          bVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)CONCAT44(extraout_var_35,iVar6),&enterId);
          if (!bVar5) goto LAB_0044bcb1;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::clearNum(local_e60,local_f5c);
        }
        if ((int)uVar25 < 0) {
LAB_0044bcf6:
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(local_e80,0);
          enterId.super_DataKey = enterId.super_DataKey & 0xffffffff00000000;
          uVar10._0_4_ = enterId.super_DataKey.info;
          uVar10._4_4_ = enterId.super_DataKey.idx;
          return (SPxId)uVar10;
        }
        iVar6 = (*(this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxRatioTester[3])(this);
        lVar13 = *(long *)(CONCAT44(extraout_var_36,iVar6) + 0xc58);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator*((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&result_1.m_backend,
                    (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)*(int *)(*(long *)(lVar13 + 0x28) + 4 + (ulong)uVar25 * 8) * 0x28 +
                       *(long *)(lVar13 + 0x20)),w);
        lVar13 = *plVar2;
        lVar24 = (ulong)uVar25 * 0x80;
        pcVar18 = &result_1.m_backend;
        puVar19 = (uint *)(lVar13 + lVar24);
        for (lVar23 = lVar12; lVar23 != 0; lVar23 = lVar23 + -1) {
          *puVar19 = (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
          puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
        }
        *(int *)(lVar13 + 0x70 + lVar24) = result_1.m_backend.exp;
        *(bool *)(lVar13 + 0x74 + lVar24) = result_1.m_backend.neg;
        *(undefined8 *)(lVar13 + 0x78 + lVar24) = result_1.m_backend._120_8_;
        iVar6 = (*(this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxRatioTester[3])(this);
        bVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(extraout_var_37,iVar6),&enterId);
        if (bVar5) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&local_130,0.0,(type *)0x0);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setValue(this_01,uVar25,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_130);
          val = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_e80;
          goto LAB_0044a74d;
        }
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&result_1.m_backend,this_01,uVar25);
        pcVar18 = &result_1.m_backend;
        pcVar15 = &local_e58;
        for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
          (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0] =
               (pcVar18->data)._M_elems[0];
          pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + ((ulong)bVar27 * -2 + 1) * 4)
          ;
        }
        local_e58.exp = result_1.m_backend.exp;
        local_e58.neg = result_1.m_backend.neg;
        local_e58.fpclass = result_1.m_backend.fpclass;
        local_e58.prec_elem = result_1.m_backend.prec_elem;
        result_1.m_backend.data._M_elems._0_8_ =
             result_1.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_e58,(int *)&result_1.m_backend);
        if (tVar4) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(*local_e78 + lVar24),
                     (cpp_dec_float<200U,_int,_void> *)(*plVar2 + lVar24));
          pcVar18 = &result_1.m_backend;
          pcVar15 = &local_d48;
          for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar27 * -8 + 4);
          }
          local_d48.exp = result_1.m_backend.exp;
          local_d48.neg = result_1.m_backend.neg;
          local_d48.fpclass = result_1.m_backend.fpclass;
          local_d48.prec_elem = result_1.m_backend.prec_elem;
          tVar4 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e58,&minStability);
          lVar13 = lVar12;
          pcVar18 = &local_d48;
          pcVar15 = &result_1.m_backend;
          if (tVar4) {
            for (; lVar13 != 0; lVar13 = lVar13 + -1) {
              (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
              pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
              pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar27 * -8 + 4);
            }
            result_1.m_backend.exp = local_d48.exp;
            result_1.m_backend.neg = local_d48.neg;
            result_1.m_backend.fpclass = local_d48.fpclass;
            result_1.m_backend.prec_elem = local_d48.prec_elem;
            if (local_d48.fpclass != cpp_dec_float_finite ||
                result_1.m_backend.data._M_elems[0] != 0) {
              result_1.m_backend.neg = (bool)(local_d48.neg ^ 1);
            }
            tVar4 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&result_1.m_backend,pnVar16);
            if (tVar4) {
              boost::multiprecision::backends::eval_divide<200u,int,void>(&minStability.m_backend,2)
              ;
              iVar6 = (*(this->
                        super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        )._vptr_SPxRatioTester[3])();
              lVar13 = *plVar2;
              puVar19 = (uint *)(lVar13 + lVar24);
              pnVar17 = &local_4b0;
              for (; lVar12 != 0; lVar12 = lVar12 + -1) {
                (pnVar17->m_backend).data._M_elems[0] = *puVar19;
                puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
                pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
              }
              local_4b0.m_backend.exp = *(int *)(lVar13 + 0x70 + lVar24);
              local_4b0.m_backend.neg = *(bool *)(lVar13 + 0x74 + lVar24);
              local_4b0.m_backend._120_8_ = *(undefined8 *)(lVar13 + 0x78 + lVar24);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_38,iVar6),uVar25,&local_4b0);
              val = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)local_e80;
              goto LAB_0044a74d;
            }
          }
        }
        else {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&result_1.m_backend,(cpp_dec_float<200U,_int,_void> *)(*local_e70 + lVar24),
                     (cpp_dec_float<200U,_int,_void> *)(*plVar2 + lVar24));
          pcVar18 = &result_1.m_backend;
          pcVar15 = &local_d48;
          for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar15->data)._M_elems[0] = (pcVar18->data)._M_elems[0];
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + (ulong)bVar27 * -8 + 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar27 * -8 + 4);
          }
          local_d48.exp = result_1.m_backend.exp;
          local_d48.neg = result_1.m_backend.neg;
          local_d48.fpclass = result_1.m_backend.fpclass;
          local_d48.prec_elem = result_1.m_backend.prec_elem;
          pcVar18 = &local_e58;
          pcVar15 = &result_1.m_backend;
          for (lVar13 = lVar12; lVar13 != 0; lVar13 = lVar13 + -1) {
            (pcVar15->data)._M_elems[0] =
                 (((cpp_dec_float<200U,_int,_void> *)&pcVar18->data)->data)._M_elems[0];
            pcVar18 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar18 + ((ulong)bVar27 * -2 + 1) * 4);
            pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar27 * -8 + 4);
          }
          result_1.m_backend.exp = local_e58.exp;
          result_1.m_backend.neg = local_e58.neg;
          result_1.m_backend.fpclass = local_e58.fpclass;
          result_1.m_backend.prec_elem = local_e58.prec_elem;
          if (local_e58.fpclass != cpp_dec_float_finite || result_1.m_backend.data._M_elems[0] != 0)
          {
            result_1.m_backend.neg = (bool)(local_e58.neg ^ 1);
          }
          tVar4 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_1.m_backend,&minStability);
          if ((tVar4) &&
             (tVar4 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_d48,pnVar16), tVar4)) {
            boost::multiprecision::backends::eval_divide<200u,int,void>(&minStability.m_backend,2);
            iVar6 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])();
            lVar13 = *plVar2;
            puVar19 = (uint *)(lVar13 + lVar24);
            pnVar17 = &local_530;
            for (; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = *puVar19;
              puVar19 = puVar19 + (ulong)bVar27 * -2 + 1;
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_530.m_backend.exp = *(int *)(lVar13 + 0x70 + lVar24);
            local_530.m_backend.neg = *(bool *)(lVar13 + 0x74 + lVar24);
            local_530.m_backend._120_8_ = *(undefined8 *)(lVar13 + 0x78 + lVar24);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_39,iVar6),uVar25,&local_530);
            val = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)local_e80;
            goto LAB_0044a74d;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator/=
                  (&local_d48,&local_e58);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_d48,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_9b8);
        val = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_e80;
      } while (tVar4);
    }
  }
LAB_0044bcb1:
  lVar14 = 0x1c;
  pcVar18 = &local_d48;
  pcVar15 = &val->m_backend;
  for (; lVar14 != 0; lVar14 = lVar14 + -1) {
    (((cpp_dec_float<200U,_int,_void> *)&pcVar15->data)->data)._M_elems[0] =
         (pcVar18->data)._M_elems[0];
    pcVar18 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar18 + ((ulong)bVar27 * -2 + 1) * 4);
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar27 * -8 + 4);
  }
  (val->m_backend).exp = local_d48.exp;
  (val->m_backend).neg = local_d48.neg;
  (val->m_backend).fpclass = local_d48.fpclass;
  (val->m_backend).prec_elem = local_d48.prec_elem;
  return (SPxId)enterId.super_DataKey;
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}